

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_message.cpp
# Opt level: O2

void test_translate(string *original,string *expected,locale *l,string *domain)

{
  string sStack_e8;
  string local_c8;
  string local_a8;
  string local_88;
  string local_68;
  string local_48;
  
  std::__cxx11::string::string((string *)&local_48,(string *)original);
  std::__cxx11::string::string((string *)&local_88,(string *)expected);
  std::__cxx11::string::string((string *)&local_a8,(string *)domain);
  strings_equal<char>(&local_48,&local_88,l,&local_a8);
  std::__cxx11::string::~string((string *)&local_a8);
  std::__cxx11::string::~string((string *)&local_88);
  std::__cxx11::string::~string((string *)&local_48);
  std::__cxx11::string::string((string *)&local_68,(string *)original);
  std::__cxx11::string::string((string *)&local_c8,(string *)expected);
  std::__cxx11::string::string((string *)&sStack_e8,(string *)domain);
  strings_equal<wchar_t>(&local_68,&local_c8,l,&sStack_e8);
  std::__cxx11::string::~string((string *)&sStack_e8);
  std::__cxx11::string::~string((string *)&local_c8);
  std::__cxx11::string::~string((string *)&local_68);
  return;
}

Assistant:

void test_translate(std::string original,std::string expected,std::locale const &l,std::string domain)
{
    strings_equal<char>(original,expected,l,domain);
    strings_equal<wchar_t>(original,expected,l,domain);
    #ifdef BOOSTER_HAS_CHAR16_T
    if(backend=="icu" || backend=="std")
        strings_equal<char16_t>(original,expected,l,domain);
    #endif
    #ifdef BOOSTER_HAS_CHAR32_T
    if(backend=="icu" || backend=="std")
        strings_equal<char32_t>(original,expected,l,domain);
    #endif
}